

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIShortValueImpl::~FIShortValueImpl(FIShortValueImpl *this)

{
  (this->super_FIShortValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008bca08;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIShortValue::~FIShortValue(&this->super_FIShortValue);
  return;
}

Assistant:

inline FIShortValueImpl(std::vector<int16_t> &&value_): strValueValid(false) { value = std::move(value_); }